

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakefilegenerator.cpp
# Opt level: O1

string * __thiscall
CMakeFileGenerator::generateCode_abi_cxx11_(string *__return_storage_ptr__,CMakeFileGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_b0;
  long local_a0;
  long lStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::operator+(&local_50,"add_executable(",&this->cpp_file_name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(this->cpp_file_name)._M_dataplus._M_p);
  paVar1 = &local_90.field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_90.field_2._M_allocated_capacity = *psVar4;
    local_90.field_2._8_8_ = plVar2[3];
    local_90._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar4;
    local_90._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_90._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a0 = *plVar3;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar3;
    local_b0 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::operator+(&local_90,"target_link_libraries(",&this->cpp_file_name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a0 = *plVar3;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar3;
    local_b0 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CMakeFileGenerator::generateCode() {
  std::string code;

  //code += "    outputPort.write(bottleToSend);\n";
  code += "cmake_minimum_required(VERSION 2.8.7)\n";
  code += "# find YARP\n";
  code += "find_package(YARP REQUIRED)\n";
  code += "\n";
  code += "# add YARP include directories\n";
  code += "include_directories(${YARP_INCLUDE_DIRS})\n";
  code += "include_directories(${CMAKE_CURRENT_SOURCE_DIR})\n";
  code += "\n";
  code += "# set up our program\n";
  code += "add_executable(" + cpp_file_name + " " + cpp_file_name + ".cpp)\n";
  code += "\n";
  code += "# link with YARP libraries\n";
  code += "target_link_libraries(" + cpp_file_name +" ${YARP_LIBRARIES})\n";
  return code;
}